

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_compact_optional.cpp
# Opt level: O0

void test_unsafe_raw_value(void)

{
  storage_type *psVar1;
  value_type local_24;
  compact_optional<ak_toolbox::compact_optional_ns::evp_int<int,__1>,_ak_toolbox::compact_optional_ns::default_tag>
  local_20;
  value_type local_1c;
  opt_int oi1;
  value_type local_14;
  opt_int oi0;
  compact_optional<ak_toolbox::compact_optional_ns::evp_int<int,__1>,_ak_toolbox::compact_optional_ns::default_tag>
  local_c;
  opt_int oiN1;
  opt_int oi_;
  
  ak_toolbox::compact_optional_ns::
  compact_optional<ak_toolbox::compact_optional_ns::evp_int<int,_-1>,_ak_toolbox::compact_optional_ns::default_tag>
  ::compact_optional(&local_c);
  local_14 = -1;
  ak_toolbox::compact_optional_ns::
  compact_optional<ak_toolbox::compact_optional_ns::evp_int<int,_-1>,_ak_toolbox::compact_optional_ns::default_tag>
  ::compact_optional(&oi0,&local_14);
  local_1c = 0;
  ak_toolbox::compact_optional_ns::
  compact_optional<ak_toolbox::compact_optional_ns::evp_int<int,_-1>,_ak_toolbox::compact_optional_ns::default_tag>
  ::compact_optional(&oi1,&local_1c);
  local_24 = 1;
  ak_toolbox::compact_optional_ns::
  compact_optional<ak_toolbox::compact_optional_ns::evp_int<int,_-1>,_ak_toolbox::compact_optional_ns::default_tag>
  ::compact_optional(&local_20,&local_24);
  psVar1 = ak_toolbox::compact_optional_ns::detail_::
           compact_optional_base<ak_toolbox::compact_optional_ns::evp_int<int,_-1>_>::
           unsafe_raw_value(&local_c.
                             super_compact_optional_base<ak_toolbox::compact_optional_ns::evp_int<int,__1>_>
                           );
  if (*psVar1 != -1) {
    __assert_fail("oi_.unsafe_raw_value() == -1",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]compact_optional/test_compact_optional.cpp"
                  ,0x78,"void test_unsafe_raw_value()");
  }
  psVar1 = ak_toolbox::compact_optional_ns::detail_::
           compact_optional_base<ak_toolbox::compact_optional_ns::evp_int<int,_-1>_>::
           unsafe_raw_value(&oi0.
                             super_compact_optional_base<ak_toolbox::compact_optional_ns::evp_int<int,__1>_>
                           );
  if (*psVar1 != -1) {
    __assert_fail("oiN1.unsafe_raw_value() == -1",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]compact_optional/test_compact_optional.cpp"
                  ,0x79,"void test_unsafe_raw_value()");
  }
  psVar1 = ak_toolbox::compact_optional_ns::detail_::
           compact_optional_base<ak_toolbox::compact_optional_ns::evp_int<int,_-1>_>::
           unsafe_raw_value(&oi1.
                             super_compact_optional_base<ak_toolbox::compact_optional_ns::evp_int<int,__1>_>
                           );
  if (*psVar1 != 0) {
    __assert_fail("oi0.unsafe_raw_value() == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]compact_optional/test_compact_optional.cpp"
                  ,0x7a,"void test_unsafe_raw_value()");
  }
  psVar1 = ak_toolbox::compact_optional_ns::detail_::
           compact_optional_base<ak_toolbox::compact_optional_ns::evp_int<int,_-1>_>::
           unsafe_raw_value(&local_20.
                             super_compact_optional_base<ak_toolbox::compact_optional_ns::evp_int<int,__1>_>
                           );
  if (*psVar1 == 1) {
    return;
  }
  __assert_fail("oi1.unsafe_raw_value() == 1",
                "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]compact_optional/test_compact_optional.cpp"
                ,0x7b,"void test_unsafe_raw_value()");
}

Assistant:

void test_unsafe_raw_value()
{
  typedef compact_optional< evp_int<int, -1> > opt_int;
  opt_int oi_, oiN1(-1), oi0(0), oi1(1);
  
  assert ( oi_.unsafe_raw_value() == -1);
  assert (oiN1.unsafe_raw_value() == -1);
  assert ( oi0.unsafe_raw_value() ==  0);
  assert ( oi1.unsafe_raw_value() ==  1);
}